

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJFileReader.cpp
# Opt level: O0

void __thiscall MeshLib::OBJFileReader::~OBJFileReader(OBJFileReader *this)

{
  int iVar1;
  Point *pPVar2;
  Point *p_1;
  int k;
  Point *p;
  int i;
  OBJFileReader *this_local;
  
  for (p._4_4_ = 0; iVar1 = Array<MeshLib::Point>::GetSize(&this->tArray), p._4_4_ < iVar1;
      p._4_4_ = p._4_4_ + 1) {
    pPVar2 = Array<MeshLib::Point>::GetAt(&this->tArray,p._4_4_);
    if ((pPVar2 != (Point *)0x0) && (pPVar2 != (Point *)0x0)) {
      Point::~Point(pPVar2);
      operator_delete(pPVar2);
    }
  }
  for (p_1._4_4_ = 0; iVar1 = Array<MeshLib::Point>::GetSize(&this->nArray), p_1._4_4_ < iVar1;
      p_1._4_4_ = p_1._4_4_ + 1) {
    pPVar2 = Array<MeshLib::Point>::GetAt(&this->nArray,p_1._4_4_);
    if ((pPVar2 != (Point *)0x0) && (pPVar2 != (Point *)0x0)) {
      Point::~Point(pPVar2);
      operator_delete(pPVar2);
    }
  }
  Array<MeshLib::Point>::~Array(&this->nArray);
  Array<MeshLib::Point>::~Array(&this->tArray);
  return;
}

Assistant:

OBJFileReader::~OBJFileReader() {
	for(int i = 0; i< tArray.GetSize(); i++) {
		Point * p = tArray.GetAt(i);
		if( p != NULL)
			delete p;
	}

	for(int k = 0; k< nArray.GetSize(); k++) {
		Point * p = nArray.GetAt(k);
		if( p != NULL)
			delete p;
	}
}